

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void RD4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  
  bVar1 = dst[-1];
  bVar2 = dst[0x1f];
  bVar3 = dst[-0x21];
  bVar4 = dst[-0x20];
  bVar5 = dst[-0x1f];
  dst[0x60] = (uint8_t)((uint)bVar2 + (uint)dst[0x3f] * 2 + 2 + (uint)dst[0x5f] >> 2);
  uVar6 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)dst[0x3f] >> 2);
  dst[0x40] = uVar6;
  dst[0x61] = uVar6;
  uVar6 = (uint8_t)((uint)bVar2 + (uint)bVar1 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x20] = uVar6;
  dst[0x41] = uVar6;
  dst[0x62] = uVar6;
  uVar6 = (uint8_t)((uint)bVar1 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  *dst = uVar6;
  dst[0x21] = uVar6;
  dst[0x42] = uVar6;
  dst[99] = uVar6;
  uVar6 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[1] = uVar6;
  dst[0x22] = uVar6;
  dst[0x43] = uVar6;
  uVar6 = (uint8_t)((uint)bVar4 + (uint)dst[-0x1e] + (uint)bVar5 * 2 + 2 >> 2);
  dst[2] = uVar6;
  dst[0x23] = uVar6;
  dst[3] = (uint8_t)((uint)dst[-0x1d] + (uint)bVar5 + (uint)dst[-0x1e] * 2 + 2 >> 2);
  return;
}

Assistant:

static void RD4_C(uint8_t* dst) {   // Down-right
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int L = dst[-1 + 3 * BPS];
  const int X = dst[-1 - BPS];
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  DST(0, 3)                                     = AVG3(J, K, L);
  DST(1, 3) = DST(0, 2)                         = AVG3(I, J, K);
  DST(2, 3) = DST(1, 2) = DST(0, 1)             = AVG3(X, I, J);
  DST(3, 3) = DST(2, 2) = DST(1, 1) = DST(0, 0) = AVG3(A, X, I);
              DST(3, 2) = DST(2, 1) = DST(1, 0) = AVG3(B, A, X);
                          DST(3, 1) = DST(2, 0) = AVG3(C, B, A);
                                      DST(3, 0) = AVG3(D, C, B);
}